

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_parser.cpp
# Opt level: O1

void __thiscall cmd_paresr::cmd_paresr(cmd_paresr *this,int argc,char **argv)

{
  iterator *piVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  queue<int,_std::deque<int,_std::allocator<int>_>_> tmp;
  int local_9c;
  deque<char,std::allocator<char>> *local_98;
  queue<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::deque<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>_>
  *local_90;
  _Deque_base<int,_std::allocator<int>_> local_88;
  
  local_98 = (deque<char,std::allocator<char>> *)&this->ops;
  (this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  (this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data._M_map
       = (_Map_pointer)0x0;
  (this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map
            ((_Deque_base<char,_std::allocator<char>_> *)local_98,0);
  local_90 = &this->args;
  (this->args).c.
  super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->args).c.
  super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->args).c.
  super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->args).c.
  super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->args).c.
  super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->args).c.
  super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->args).c.
  super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->args).c.
  super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->args).c.
  super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->args).c.
  super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                       *)local_90,0);
  this->opnum = 0;
  this->pos = 0;
  if (1 < argc) {
    uVar4 = 1;
    do {
      pcVar2 = (this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pcVar2 == (this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                  (local_98,argv[(int)uVar4] + 1);
      }
      else {
        *pcVar2 = argv[(int)uVar4][1];
        piVar1 = &(this->ops).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
      std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
      this->opnum = this->opnum + 1;
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
      if ((int)uVar3 < argc) {
        uVar4 = (ulong)(int)uVar3;
        do {
          if (*argv[uVar4] == '-') goto LAB_001030e4;
          local_9c = atoi(argv[uVar4]);
          std::deque<int,_std::allocator<int>_>::emplace_back<int>
                    ((deque<int,_std::allocator<int>_> *)&local_88,&local_9c);
          uVar4 = uVar4 + 1;
        } while ((uint)argc != uVar4);
        uVar4 = (ulong)(uint)argc;
      }
LAB_001030e4:
      std::
      deque<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
      ::push_back(&local_90->c,(value_type *)&local_88);
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
    } while ((int)uVar4 < argc);
  }
  return;
}

Assistant:

cmd_paresr::cmd_paresr(int argc, char **argv) {
  pos = 0;
  opnum = 0;
  for (int i = 1; i < argc; i++) {
    // Set operation
    ops.push(argv[i][1]);
    queue<int> tmp;
    opnum++;
    i++;
    // Get args
    while (i < argc && argv[i][0] != '-')
      tmp.push(atoi(argv[i++]));
    // Set args
    args.push(tmp);
    i--;
  }
}